

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

char * __thiscall
cbtCollisionWorldImporter::duplicateName(cbtCollisionWorldImporter *this,char *name)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *newName;
  char *local_30;
  
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    iVar1 = (int)sVar2;
    __dest = (char *)operator_new__((long)(iVar1 + 1));
    local_30 = __dest;
    memcpy(__dest,name,(long)iVar1);
    __dest[iVar1] = '\0';
    cbtAlignedObjectArray<char_*>::push_back(&this->m_allocatedNames,&local_30);
    return local_30;
  }
  return (char *)0x0;
}

Assistant:

char* cbtCollisionWorldImporter::duplicateName(const char* name)
{
	if (name)
	{
		int l = (int)strlen(name);
		char* newName = new char[l + 1];
		memcpy(newName, name, l);
		newName[l] = 0;
		m_allocatedNames.push_back(newName);
		return newName;
	}
	return 0;
}